

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O0

void __thiscall PhyloTree::PhyloTree(PhyloTree *this,PhyloTree *t)

{
  string *in_RSI;
  string *in_RDI;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_stack_00000008;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_stack_00000010;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector
            (in_stack_00000010,in_stack_00000008);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_00000010,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_00000008);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_00000010,
             (vector<double,_std::allocator<double>_> *)in_stack_00000008);
  return;
}

Assistant:

PhyloTree::PhyloTree(const PhyloTree &t) = default;